

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::PythonGenerator::GenPackageReference_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,Type *type)

{
  string local_30;
  
  if (type->struct_def == (StructDef *)0x0) {
    if (type->enum_def == (EnumDef *)0x0) {
      GenTypeGet_abi_cxx11_(&local_30,this,type);
      std::operator+(__return_storage_ptr__,".",&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
      ModuleFor<flatbuffers::EnumDef>(__return_storage_ptr__,this,type->enum_def);
    }
  }
  else {
    ModuleFor<flatbuffers::StructDef>(__return_storage_ptr__,this,type->struct_def);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenPackageReference(const Type &type) const {
    if (type.struct_def) return ModuleFor(type.struct_def);
    if (type.enum_def) return ModuleFor(type.enum_def);
    return "." + GenTypeGet(type);
  }